

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,FileDescriptor *file,GeneratorOptions *options,GeneratorContext *context,
          bool use_short_name)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long *plVar3;
  char ***pppcVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined4 extraout_var;
  LogMessage *other;
  AnnotationCollector *annotation_collector_00;
  char *pcVar7;
  string filename;
  GeneratedCodeInfo annotations;
  Printer printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  undefined8 *local_170;
  undefined8 local_160;
  undefined8 uStack_158;
  Generator *local_150;
  undefined1 local_148 [56];
  GeneratedCodeInfo local_110;
  Printer local_e0;
  AnnotationCollector local_40;
  GeneratedCodeInfo *local_38;
  ZeroCopyOutputStream *output;
  
  pppcVar4 = (char ***)&local_e0.buffer_;
  pcVar2 = (options->output_dir)._M_dataplus._M_p;
  local_150 = this;
  local_e0._0_8_ = pppcVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar2,pcVar2 + (options->output_dir)._M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  plVar3 = *(long **)file;
  if (use_short_name) {
    std::__cxx11::string::rfind((char)plVar3,0x2f);
    std::__cxx11::string::substr((ulong)&local_110,(ulong)plVar3);
  }
  else {
    local_110.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)&local_110.annotation_;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,*plVar3,plVar3[1] + *plVar3);
  }
  anon_unknown_0::GetJSFilename((string *)local_148,options,(string *)&local_110);
  pcVar7 = (char *)0xf;
  if ((char ***)local_e0._0_8_ != pppcVar4) {
    pcVar7 = local_e0.buffer_;
  }
  if (pcVar7 < (char *)(local_148._8_8_ + (long)local_e0.output_)) {
    pcVar7 = (char *)0xf;
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      pcVar7 = (char *)local_148._16_8_;
    }
    if ((char *)(local_148._8_8_ + (long)local_e0.output_) <= pcVar7) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_148,0,(char *)0x0,local_e0._0_8_);
      goto LAB_0025e9ce;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append(&local_e0.variable_delimiter_,local_148._0_8_);
LAB_0025e9ce:
  local_170 = &local_160;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *puVar1;
    local_170 = (undefined8 *)*puVar6;
  }
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_);
  }
  if ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
      local_110.super_Message.super_MessageLite._vptr_MessageLite != &local_110.annotation_) {
    operator_delete(local_110.super_Message.super_MessageLite._vptr_MessageLite);
  }
  if ((char ***)local_e0._0_8_ != pppcVar4) {
    operator_delete((void *)local_e0._0_8_);
  }
  iVar5 = (*context->_vptr_GeneratorContext[2])(context);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
  if (output == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xe09);
    other = internal::LogMessage::operator<<((LogMessage *)local_148,"CHECK failed: output: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_e0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_148);
  }
  GeneratedCodeInfo::GeneratedCodeInfo(&local_110,(Arena *)0x0,false);
  local_40._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004dc430;
  annotation_collector_00 = (AnnotationCollector *)0x0;
  if (options->annotate_code != false) {
    annotation_collector_00 = &local_40;
  }
  local_38 = &local_110;
  io::Printer::Printer(&local_e0,output,'$',annotation_collector_00);
  GenerateFile(local_150,options,&local_e0,file);
  if ((local_e0.failed_ == false) && (options->annotate_code == true)) {
    anon_unknown_0::EmbedCodeAnnotations(&local_110,&local_e0);
  }
  io::Printer::~Printer(&local_e0);
  GeneratedCodeInfo::~GeneratedCodeInfo(&local_110);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  return (bool)(local_e0.failed_ ^ 1);
}

Assistant:

bool Generator::GenerateFile(const FileDescriptor* file,
                             const GeneratorOptions& options,
                             GeneratorContext* context,
                             bool use_short_name) const {
  std::string filename =
      options.output_dir + "/" +
      GetJSFilename(options, use_short_name
                                 ? file->name().substr(file->name().rfind('/'))
                                 : file->name());
  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output);
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer printer(output.get(), '$',
                      options.annotate_code ? &annotation_collector : nullptr);

  GenerateFile(options, &printer, file);

  if (printer.failed()) {
    return false;
  }

  if (options.annotate_code) {
    EmbedCodeAnnotations(annotations, &printer);
  }

  return true;
}